

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O2

bool __thiscall lzham::search_accelerator::find_len2_matches(search_accelerator *this)

{
  uchar *puVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  if (((this->m_digram_hash).m_size == 0) &&
     (bVar4 = vector<unsigned_int>::try_resize(&this->m_digram_hash,0x1000,false), !bVar4)) {
    return false;
  }
  if (((this->m_digram_next).m_size < this->m_lookahead_size) &&
     (bVar4 = vector<unsigned_int>::try_resize(&this->m_digram_next,this->m_lookahead_size,false),
     !bVar4)) {
    return false;
  }
  uVar5 = this->m_max_dict_size_mask & this->m_lookahead_pos;
  puVar1 = (this->m_dict).m_p;
  puVar2 = (this->m_digram_hash).m_p;
  puVar3 = (this->m_digram_next).m_p;
  for (lVar6 = 0; uVar7 = (long)(int)this->m_lookahead_size - 1, lVar6 < (long)uVar7;
      lVar6 = lVar6 + 1) {
    uVar7 = (ulong)((uint)puVar1[(ulong)uVar5 + lVar6 & 0xffffffff] << 2 ^
                   (uint)puVar1[uVar5 + (int)lVar6 + 1] << 6);
    puVar3[lVar6] = *(uint *)((long)puVar2 + uVar7);
    *(uint *)((long)puVar2 + uVar7) = this->m_lookahead_pos + (int)lVar6;
  }
  (this->m_digram_next).m_p[uVar7 & 0xffffffff] = 0;
  return true;
}

Assistant:

bool search_accelerator::find_len2_matches()
   {
      enum { cDigramHashSize = 4096 };

      if (!m_digram_hash.size())
      {
         if (!m_digram_hash.try_resize(cDigramHashSize))
            return false;
      }

      if (m_digram_next.size() < m_lookahead_size)
      {
         if (!m_digram_next.try_resize(m_lookahead_size))
            return false;
      }

      uint lookahead_dict_pos = m_lookahead_pos & m_max_dict_size_mask;

      for (int lookahead_ofs = 0; lookahead_ofs < ((int)m_lookahead_size - 1); ++lookahead_ofs, ++lookahead_dict_pos)
      {
         uint c0 = m_dict[lookahead_dict_pos];
         uint c1 = m_dict[lookahead_dict_pos + 1];

         uint h = hash2_to_12(c0, c1) & (cDigramHashSize - 1);

         m_digram_next[lookahead_ofs] = m_digram_hash[h];
         m_digram_hash[h] = m_lookahead_pos + lookahead_ofs;
      }

      m_digram_next[m_lookahead_size - 1] = 0;

      return true;
   }